

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::LoadIniSettingsFromMemory(char *ini_data,size_t ini_size)

{
  ImGuiContext *pIVar1;
  char *__dest;
  char *pcVar2;
  ImGuiSettingsHandler *pIVar3;
  void *pvVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  
  pIVar1 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xf03,"void ImGui::LoadIniSettingsFromMemory(const char *, size_t)");
  }
  if ((GImGui->SettingsLoaded != false) || (GImGui->FrameCount != 0)) {
    __assert_fail("g.SettingsLoaded == false && g.FrameCount == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xf04,"void ImGui::LoadIniSettingsFromMemory(const char *, size_t)");
  }
  if (ini_size == 0) {
    ini_size = strlen(ini_data);
  }
  GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
  __dest = (char *)(*GImAllocatorAllocFunc)(ini_size + 1,GImAllocatorUserData);
  memcpy(__dest,ini_data,ini_size);
  __dest[ini_size] = '\0';
  if (0 < (long)ini_size) {
    pcVar10 = __dest + ini_size;
    pvVar4 = (void *)0x0;
    pIVar3 = (ImGuiSettingsHandler *)0x0;
    pcVar5 = __dest;
LAB_00179ec2:
    pcVar2 = pcVar5 + 2;
    pcVar9 = pcVar5 + 3;
    for (; (*pcVar5 == '\n' || (*pcVar5 == '\r')); pcVar5 = pcVar5 + 1) {
      pcVar2 = pcVar2 + 1;
      pcVar9 = pcVar9 + 1;
    }
    if (pcVar5 < pcVar10) {
      uVar6 = 0;
      do {
        if ((pcVar5[uVar6] == '\n') || (pcVar5[uVar6] == '\r')) break;
        lVar8 = uVar6 + 1;
        uVar6 = uVar6 + 1;
      } while (pcVar5 + lVar8 < pcVar10);
      pcVar11 = pcVar5 + uVar6;
      *pcVar11 = '\0';
      if (((uVar6 == 0) || (*pcVar5 != '[')) || (pcVar5[uVar6 - 1] != ']')) goto LAB_00179f5b;
      pcVar5[uVar6 - 1] = '\0';
      if (2 < uVar6) {
        lVar8 = uVar6 - 2;
        lVar7 = uVar6 - 3;
        do {
          if (pcVar2[-1] == ']') {
            if (pcVar2 < pcVar5 + (uVar6 - 1)) goto LAB_00179f85;
            break;
          }
          pcVar2 = pcVar2 + 1;
          pcVar9 = pcVar9 + 1;
          lVar7 = lVar7 + -1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      goto LAB_00179f95;
    }
    *pcVar5 = '\0';
    pcVar11 = pcVar5;
LAB_00179f5b:
    if ((pIVar3 != (ImGuiSettingsHandler *)0x0) && (pvVar4 != (void *)0x0)) {
      (*pIVar3->ReadLineFn)(pIVar1,pIVar3,pvVar4,pcVar5);
    }
    goto LAB_00179f72;
  }
LAB_00179fd6:
  GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
LAB_00179fdd:
  (*GImAllocatorFreeFunc)(__dest,GImAllocatorUserData);
  pIVar1->SettingsLoaded = true;
  return;
  while( true ) {
    pcVar9 = pcVar9 + 1;
    lVar7 = lVar7 + -1;
    if (lVar7 == 0) break;
LAB_00179f85:
    if (pcVar9[-1] == '[') {
      pcVar2[-1] = '\0';
      pcVar2 = pcVar5 + 1;
      goto LAB_00179f9f;
    }
  }
LAB_00179f95:
  pcVar2 = "Window";
  pcVar9 = pcVar5 + 1;
LAB_00179f9f:
  pIVar3 = FindSettingsHandler(pcVar2);
  if (pIVar3 == (ImGuiSettingsHandler *)0x0) {
    pIVar3 = (ImGuiSettingsHandler *)0x0;
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = (*pIVar3->ReadOpenFn)(pIVar1,pIVar3,pcVar9);
  }
LAB_00179f72:
  pcVar5 = pcVar11 + 1;
  if (pcVar10 <= pcVar5) goto LAB_00179fcd;
  goto LAB_00179ec2;
LAB_00179fcd:
  if (__dest == (char *)0x0) goto LAB_00179fdd;
  goto LAB_00179fd6;
}

Assistant:

void ImGui::LoadIniSettingsFromMemory(const char* ini_data, size_t ini_size)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    IM_ASSERT(g.SettingsLoaded == false && g.FrameCount == 0);

    // For user convenience, we allow passing a non zero-terminated string (hence the ini_size parameter).
    // For our convenience and to make the code simpler, we'll also write zero-terminators within the buffer. So let's create a writable copy..
    if (ini_size == 0)
        ini_size = strlen(ini_data);
    char* buf = (char*)ImGui::MemAlloc(ini_size + 1);
    char* buf_end = buf + ini_size;
    memcpy(buf, ini_data, ini_size);
    buf[ini_size] = 0;

    void* entry_data = NULL;
    ImGuiSettingsHandler* entry_handler = NULL;

    char* line_end = NULL;
    for (char* line = buf; line < buf_end; line = line_end + 1)
    {
        // Skip new lines markers, then find end of the line
        while (*line == '\n' || *line == '\r')
            line++;
        line_end = line;
        while (line_end < buf_end && *line_end != '\n' && *line_end != '\r')
            line_end++;
        line_end[0] = 0;

        if (line[0] == '[' && line_end > line && line_end[-1] == ']')
        {
            // Parse "[Type][Name]". Note that 'Name' can itself contains [] characters, which is acceptable with the current format and parsing code.
            line_end[-1] = 0;
            const char* name_end = line_end - 1;
            const char* type_start = line + 1;
            char* type_end = (char*)(intptr_t)ImStrchrRange(type_start, name_end, ']');
            const char* name_start = type_end ? ImStrchrRange(type_end + 1, name_end, '[') : NULL;
            if (!type_end || !name_start)
            {
                name_start = type_start; // Import legacy entries that have no type
                type_start = "Window";
            }
            else
            {
                *type_end = 0; // Overwrite first ']'
                name_start++;  // Skip second '['
            }
            entry_handler = FindSettingsHandler(type_start);
            entry_data = entry_handler ? entry_handler->ReadOpenFn(&g, entry_handler, name_start) : NULL;
        }
        else if (entry_handler != NULL && entry_data != NULL)
        {
            // Let type handler parse the line
            entry_handler->ReadLineFn(&g, entry_handler, entry_data, line);
        }
    }
    ImGui::MemFree(buf);
    g.SettingsLoaded = true;
}